

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall RefTable::Resize(RefTable *this,SQUnsignedInteger size)

{
  RefNode **p;
  RefNode *pRVar1;
  SQHash SVar2;
  RefNode *pRVar3;
  RefNode *nn;
  SQUnsignedInteger n;
  SQUnsignedInteger nfound;
  SQUnsignedInteger oldnumofslots;
  RefNode *t;
  RefNode **oldbucks;
  SQUnsignedInteger size_local;
  RefTable *this_local;
  
  p = this->_buckets;
  oldnumofslots = (SQUnsignedInteger)this->_nodes;
  pRVar1 = (RefNode *)this->_numofslots;
  AllocNodes(this,size);
  n = 0;
  nn = (RefNode *)0x0;
  do {
    if (pRVar1 <= nn) {
      if ((RefNode *)n == pRVar1) {
        sq_vm_free(p,(long)pRVar1 * 0x28);
        return;
      }
      __assert_fail("nfound == oldnumofslots",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                    ,0x1e8,"void RefTable::Resize(SQUnsignedInteger)");
    }
    if (*(int *)oldnumofslots != 0x1000001) {
      if (*(long *)(oldnumofslots + 0x10) == 0) {
        __assert_fail("t->refs != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                      ,0x1e0,"void RefTable::Resize(SQUnsignedInteger)");
      }
      SVar2 = HashObj((SQObjectPtr *)oldnumofslots);
      pRVar3 = Add(this,SVar2 & this->_numofslots - 1,(SQObject *)oldnumofslots);
      pRVar3->refs = *(SQUnsignedInteger *)(oldnumofslots + 0x10);
      ::SQObjectPtr::Null((SQObjectPtr *)oldnumofslots);
      n = n + 1;
    }
    oldnumofslots = oldnumofslots + 0x20;
    nn = (RefNode *)((long)&(nn->obj).super_SQObject._type + 1);
  } while( true );
}

Assistant:

void RefTable::Resize(SQUnsignedInteger size)
{
    RefNode **oldbucks = _buckets;
    RefNode *t = _nodes;
    SQUnsignedInteger oldnumofslots = _numofslots;
    AllocNodes(size);
    //rehash
    SQUnsignedInteger nfound = 0;
    for(SQUnsignedInteger n = 0; n < oldnumofslots; n++) {
        if(type(t->obj) != OT_NULL) {
            //add back;
            assert(t->refs != 0);
            RefNode *nn = Add(::HashObj(t->obj)&(_numofslots-1),t->obj);
            nn->refs = t->refs;
            t->obj.Null();
            nfound++;
        }
        t++;
    }
    assert(nfound == oldnumofslots);
    SQ_FREE(oldbucks,(oldnumofslots * sizeof(RefNode *)) + (oldnumofslots * sizeof(RefNode)));
}